

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestrm.cpp
# Opt level: O2

UBool T_FileStream_file_exists(char *filename)

{
  FILE *__stream;
  
  __stream = fopen(filename,"r");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

U_CAPI UBool U_EXPORT2
T_FileStream_file_exists(const char* filename)
{
    FILE* temp = fopen(filename, "r");
    if (temp) {
        fclose(temp);
        return TRUE;
    } else
        return FALSE;
}